

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

void setupBiomeFilter(BiomeFilter *bf,int mc,uint32_t flags,int *required,int requiredLen,
                     int *excluded,int excludedLen,int *matchany,int matchanyLen)

{
  uint64_t *puVar1;
  byte *pbVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t *puVar8;
  uint64_t uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t *puVar13;
  undefined4 in_register_00000084;
  byte bVar14;
  int id;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint64_t m;
  uint64_t *local_138;
  uint64_t *local_130;
  uint local_124;
  uint64_t *local_120;
  ulong local_118;
  int *local_110;
  BiomeFilter ibf;
  
  local_118 = CONCAT44(in_register_00000084,requiredLen);
  uVar16 = 0;
  local_110 = required;
  memset(bf,0,0xd8);
  bf->flags = flags;
  local_120 = &bf->otempToFind;
  puVar1 = &bf->riverToFind;
  local_138 = &bf->riverToFindM;
  uVar11 = (ulong)(uint)matchanyLen;
  uVar17 = flags;
  if (matchanyLen < 1) {
    uVar11 = uVar16;
  }
  for (; uVar11 != uVar16; uVar16 = uVar16 + 1) {
    uVar17 = matchany[uVar16];
    uVar15 = uVar17 - 0x80 & 0xff;
    if ((int)uVar17 < 0x80) {
      uVar15 = uVar17;
    }
    (&bf->biomeToPick)[0x7f < (int)uVar17] =
         (&bf->biomeToPick)[0x7f < (int)uVar17] | 1L << ((byte)uVar15 & 0x3f);
    local_124 = uVar17;
    setupBiomeFilter(&ibf,mc,0,(int *)&local_124,1,(int *)0x0,0,(int *)0x0,0);
    if (uVar16 == 0) {
      bf->tempsToFind = ibf.tempsToFind;
      bf->otempToFind = CONCAT44(ibf.otempToFind._4_4_,(uint)ibf.otempToFind);
      bf->majorToFind = CONCAT44(ibf.majorToFind._4_4_,(uint)ibf.majorToFind);
      bf->edgesToFind = ibf.edgesToFind;
      bf->raresToFind = ibf.raresToFind;
      bf->raresToFindM = ibf.raresToFindM;
      bf->shoreToFind = ibf.shoreToFind;
      bf->shoreToFindM = ibf.shoreToFindM;
      bf->riverToFind = ibf.riverToFind;
      bf->riverToFindM = ibf.riverToFindM;
      uVar18 = ibf.oceanToFind;
    }
    else {
      bf->tempsToFind = bf->tempsToFind & ibf.tempsToFind;
      uVar15 = *(uint *)((long)&bf->otempToFind + 4);
      uVar9 = bf->majorToFind;
      uVar3 = *(uint *)((long)&bf->majorToFind + 4);
      uVar18 = bf->edgesToFind;
      uVar12 = bf->raresToFind;
      uVar4 = bf->raresToFindM;
      uVar5 = bf->shoreToFind;
      uVar6 = bf->shoreToFindM;
      uVar7 = bf->riverToFind;
      *(uint *)&bf->otempToFind = (uint)bf->otempToFind & (uint)ibf.otempToFind;
      *(uint *)((long)&bf->otempToFind + 4) = uVar15 & ibf.otempToFind._4_4_;
      *(uint *)&bf->majorToFind = (uint)uVar9 & (uint)ibf.majorToFind;
      *(uint *)((long)&bf->majorToFind + 4) = uVar3 & ibf.majorToFind._4_4_;
      bf->edgesToFind = ibf.edgesToFind & uVar18;
      bf->raresToFind = ibf.raresToFind & uVar12;
      bf->raresToFindM = ibf.raresToFindM & uVar4;
      bf->shoreToFind = ibf.shoreToFind & uVar5;
      bf->shoreToFindM = ibf.shoreToFindM & uVar6;
      bf->riverToFind = ibf.riverToFind & uVar7;
      bf->riverToFindM = bf->riverToFindM & ibf.riverToFindM;
      uVar18 = bf->oceanToFind & ibf.oceanToFind;
    }
    bf->oceanToFind = uVar18;
  }
  puVar13 = &bf->biomeToExcl;
  uVar11 = 0;
  uVar16 = 0;
  if (0 < excludedLen) {
    uVar16 = (ulong)(uint)excludedLen;
  }
  for (; uVar16 != uVar11; uVar11 = uVar11 + 1) {
    uVar17 = excluded[uVar11];
    if ((uVar17 & 0xffffff40) != 0) goto LAB_0010cb94;
    uVar15 = uVar17 - 0x80;
    puVar8 = &bf->biomeToExclM;
    if (uVar17 < 0x80) {
      uVar15 = uVar17;
      puVar8 = puVar13;
    }
    *puVar8 = *puVar8 | 1L << ((byte)uVar15 & 0x3f);
  }
  local_124 = uVar17;
  if (9 < mc && excludedLen != 0) {
    local_130 = &bf->biomeToExclM;
    for (uVar11 = 0; uVar11 != 10; uVar11 = uVar11 + 1) {
      uVar17 = (uint)uVar11;
      if (4 < uVar11) {
        uVar17 = (uint)uVar11 - 5 | 0xf00;
      }
      m = 0;
      ibf.tempsToFind = 0;
      genPotential(&ibf.tempsToFind,&m,0xe,mc,flags,uVar17);
      if (((*puVar13 & ibf.tempsToFind) != 0) || ((*local_130 & m) != 0)) {
        bf->tempsToExcl = bf->tempsToExcl | 1L << ((byte)uVar11 & 0x3f);
      }
    }
    for (uVar11 = 0; uVar11 != 0x100; uVar11 = uVar11 + 1) {
      id = (int)uVar11;
      iVar10 = isOverworld(mc,id);
      if (iVar10 != 0) {
        if (uVar11 < 0x80) {
          m = 0;
          ibf.tempsToFind = 0;
          genPotential(&ibf.tempsToFind,&m,0x15,mc,flags,id);
          if (((ibf.tempsToFind & ~*puVar13) != 0) || ((m & ~*local_130) != 0)) {
            bf->majorToExcl = bf->majorToExcl | 1L << ((byte)uVar11 & 0x3f);
          }
        }
        m = 0;
        ibf.tempsToFind = 0;
        genPotential(&ibf.tempsToFind,&m,0x19,mc,flags,id);
        if (((ibf.tempsToFind & ~*puVar13) != 0) || ((m & ~*local_130) != 0)) {
          uVar16 = uVar11 - 0x80;
          if (uVar11 < 0x80) {
            uVar16 = uVar11;
          }
          bf->edgesToExcl = bf->edgesToExcl | 1L << ((byte)uVar16 & 0x3f);
        }
        m = 0;
        ibf.tempsToFind = 0;
        genPotential(&ibf.tempsToFind,&m,0x1e,mc,flags,id);
        if (((ibf.tempsToFind & ~*puVar13) != 0) || ((m & ~*local_130) != 0)) {
          uVar16 = uVar11 - 0x80;
          if (0x7f >= uVar11) {
            uVar16 = uVar11;
          }
          (&bf->raresToExcl)[0x7f < uVar11] =
               (&bf->raresToExcl)[0x7f < uVar11] | 1L << ((byte)uVar16 & 0x3f);
        }
        m = 0;
        ibf.tempsToFind = 0;
        genPotential(&ibf.tempsToFind,&m,0x22,mc,flags,id);
        if (((ibf.tempsToFind & ~*puVar13) != 0) || ((m & ~*local_130) != 0)) {
          uVar16 = uVar11 - 0x80;
          if (0x7f >= uVar11) {
            uVar16 = uVar11;
          }
          (&bf->shoreToExcl)[0x7f < uVar11] =
               (&bf->shoreToExcl)[0x7f < uVar11] | 1L << ((byte)uVar16 & 0x3f);
        }
        m = 0;
        ibf.tempsToFind = 0;
        genPotential(&ibf.tempsToFind,&m,0x2f,mc,flags,id);
        if (((ibf.tempsToFind & ~*puVar13) != 0) || ((m & ~*local_130) != 0)) {
          uVar16 = uVar11 - 0x80;
          if (0x7f >= uVar11) {
            uVar16 = uVar11;
          }
          (&bf->riverToExcl)[0x7f < uVar11] =
               (&bf->riverToExcl)[0x7f < uVar11] | 1L << ((byte)uVar16 & 0x3f);
        }
      }
    }
  }
  uVar16 = 0;
  uVar11 = local_118 & 0xffffffff;
  if ((int)local_118 < 1) {
    uVar11 = uVar16;
  }
  do {
    uVar18 = 4;
    if (uVar11 == uVar16) {
      bf->biomeToFind = bf->riverToFind & 0xfffffffffefffffe | bf->oceanToFind;
      bf->biomeToFindM = bf->riverToFindM;
      bf->shoreToFind = bf->riverToFind & 0xfffffffffffff77f;
      bf->shoreToFindM = bf->riverToFindM;
      uVar17 = (uint)bf->tempsToFind;
      bf->specialCnt = (uVar17 >> 7 & 1) + (uVar17 >> 6 & 1) + (uint)((uVar17 >> 8 & 1) != 0);
      return;
    }
    uVar17 = local_110[uVar16];
    if ((uVar17 & 0xffffff40) != 0) {
LAB_0010cb94:
      fprintf(_stderr,"setupBiomeFilter: biomeID=%d not supported.\n",(ulong)uVar17);
      exit(-1);
    }
    uVar15 = uVar17 & 0xff;
    bVar14 = (byte)uVar17;
    puVar13 = puVar1;
    switch(uVar17 & 0xff) {
    case 1:
    case 4:
    case 0x12:
    case 0x22:
      goto switchD_0010c7b3_caseD_1;
    case 2:
      goto switchD_0010c7b3_caseD_2;
    case 3:
      *(byte *)&bf->majorToFind = (byte)bf->majorToFind | 8;
      goto switchD_0010c7b3_caseD_1;
    case 5:
    case 0x13:
      uVar18 = 1L << (bVar14 & 0x3f);
      bf->edgesToFind = bf->edgesToFind | 0x20;
      bf->raresToFind = uVar18 | bf->raresToFind;
      goto switchD_0010c7b3_caseD_2;
    case 6:
    case 0x1b:
    case 0x1c:
    case 0x1d:
switchD_0010c7b3_caseD_6:
      *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 4;
      uVar15 = uVar17 & 0x3f;
      uVar12 = 0x20000000;
      if (((uVar15 == 0x1d) || (uVar12 = 0x8000000, uVar15 - 0x1b < 2)) ||
         (uVar12 = 0x40, uVar15 == 6)) {
        auVar19._0_8_ = bf->majorToFind;
        auVar19._8_8_ = bf->edgesToFind;
        goto LAB_0010c898;
      }
      break;
    case 7:
    case 8:
    case 9:
    case 10:
    case 0x14:
    case 0x18:
switchD_0010c7b3_caseD_7:
      iVar10 = isOceanic(uVar17);
      if (iVar10 == 0) {
        uVar18 = 1L << (bVar14 & 0x3f);
        puVar13 = local_138;
        if (uVar17 < 0x40) {
          puVar13 = puVar1;
        }
        goto switchD_0010c7b3_caseD_2;
      }
      *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 1;
      uVar18 = 1L << (bVar14 & 0x3f);
      bf->oceanToFind = bf->oceanToFind | uVar18;
      iVar10 = isShallowOcean(uVar17);
      if (iVar10 == 0) {
        uVar18 = 0x100000000000;
        if (bVar14 == 0x32) {
          uVar18 = 0x400;
LAB_0010cae9:
          *local_120 = *local_120 | uVar18;
        }
        else {
          if (uVar15 == 0x2f) goto LAB_0010cae9;
          if (uVar15 == 0x18) {
            uVar18 = 1;
            goto LAB_0010cae9;
          }
        }
        if ((flags & 4) == 0) {
          pbVar2 = (byte *)((long)&bf->raresToFind + 3);
          *pbVar2 = *pbVar2 | 1;
          uVar18 = 0x1000000;
          goto switchD_0010c7b3_caseD_2;
        }
      }
      else {
        puVar13 = local_120;
        if (uVar17 - 0x2f < 0xfffffffe) goto switchD_0010c7b3_caseD_2;
      }
      goto LAB_0010ca14;
    case 0xb:
    case 0xc:
    case 0xd:
    case 0x1e:
    case 0x1f:
switchD_0010c7b3_caseD_b:
      *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 0x10;
      if ((uVar15 - 0x1e < 2) || (uVar15 == 0x9e)) {
        pbVar2 = (byte *)((long)&bf->edgesToFind + 3);
        *pbVar2 = *pbVar2 | 0x40;
      }
      else {
        pbVar2 = (byte *)((long)&bf->edgesToFind + 1);
        *pbVar2 = *pbVar2 | 0x10;
        if (uVar17 == 0xb) {
          pbVar2 = (byte *)((long)&bf->raresToFind + 1);
          *pbVar2 = *pbVar2 | 0x10;
          uVar18 = 0x800;
          goto switchD_0010c7b3_caseD_2;
        }
      }
      break;
    case 0xe:
      pbVar2 = (byte *)((long)&bf->raresToFind + 1);
      *pbVar2 = *pbVar2 | 0x40;
    case 0xf:
      *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 1;
      pbVar2 = (byte *)((long)&bf->majorToFind + 1);
      *pbVar2 = *pbVar2 | 0x40;
    case 0x10:
    case 0x19:
      goto switchD_0010c7b3_caseD_10;
    case 0x11:
    case 0x23:
    case 0x24:
switchD_0010c7b3_caseD_11:
      *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 2;
      uVar12 = 0x800000000;
      if (uVar17 == 0x11) {
        uVar12 = uVar18;
      }
      if (uVar17 == 0x82) {
        uVar12 = uVar18;
      }
      auVar19._0_8_ = bf->majorToFind;
      auVar19._8_8_ = bf->edgesToFind;
LAB_0010c898:
      auVar20._8_4_ = (int)uVar12;
      auVar20._0_8_ = uVar12;
      auVar20._12_4_ = (int)(uVar12 >> 0x20);
      bf->majorToFind = SUB168(auVar20 | auVar19,0);
      bf->edgesToFind = SUB168(auVar20 | auVar19,8);
      break;
    case 0x15:
    case 0x16:
    case 0x17:
switchD_0010c7b3_caseD_15:
      *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 0x80;
      pbVar2 = (byte *)((long)&bf->majorToFind + 2);
      *pbVar2 = *pbVar2 | 0x20;
      if ((uVar17 & 0xbe) == 0xa8) {
        pbVar2 = (byte *)((long)&bf->edgesToFind + 5);
        *pbVar2 = *pbVar2 | 1;
      }
      else {
        if (bVar14 == 0x17) {
          uVar18 = 0x800000;
          goto switchD_0010c7b3_caseD_2;
        }
        if (uVar15 != 0x97) {
          pbVar2 = (byte *)((long)&bf->edgesToFind + 2);
          *pbVar2 = *pbVar2 | 0x20;
          break;
        }
        pbVar2 = (byte *)((long)&bf->edgesToFind + 2);
        *pbVar2 = *pbVar2 | 0x80;
      }
      goto switchD_0010c7f4_caseD_a2;
    case 0x1a:
      *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 0x10;
      goto switchD_0010c7b3_caseD_10;
    case 0x20:
    case 0x21:
switchD_0010c7b3_caseD_20:
      pbVar2 = (byte *)((long)&bf->tempsToFind + 1);
      *pbVar2 = *pbVar2 | 1;
      bf->majorToFind = bf->majorToFind | 0x100000000;
      bf->edgesToFind = bf->edgesToFind | 0x100000000;
      break;
    case 0x25:
    case 0x26:
    case 0x27:
switchD_0010c7b3_caseD_25:
      *(byte *)&bf->tempsToFind = (byte)bf->tempsToFind | 0x40;
      uVar18 = 0x8000000000;
      if ((uVar17 & 0x3f) == 0x27) {
LAB_0010c8c1:
        bf->majorToFind = bf->majorToFind | uVar18;
      }
      else if ((uVar17 & 0x3f) == 0x26) {
        uVar18 = 0x4000000000;
        goto LAB_0010c8c1;
      }
      break;
    default:
      switch(uVar17 & 0xff) {
      case 0x81:
        *(byte *)&bf->raresToFindM = (byte)bf->raresToFindM | 2;
        goto LAB_0010c9ee;
      case 0x82:
      case 0xa3:
      case 0xa4:
        goto switchD_0010c7b3_caseD_11;
      case 0x83:
        *(byte *)&bf->majorToFind = (byte)bf->majorToFind | 8;
        break;
      case 0x84:
        *(byte *)&bf->raresToFindM = (byte)bf->raresToFindM | 0x10;
LAB_0010c9ee:
        uVar18 = 1L << (bVar14 & 0x3f);
        puVar13 = local_138;
        goto switchD_0010c7b3_caseD_2;
      case 0x85:
        *(byte *)&bf->edgesToFind = (byte)bf->edgesToFind | 0x20;
        break;
      case 0x86:
      case 0x9b:
      case 0x9c:
      case 0x9d:
        goto switchD_0010c7b3_caseD_6;
      default:
        goto switchD_0010c7b3_caseD_7;
      case 0x8c:
      case 0x9e:
        goto switchD_0010c7b3_caseD_b;
      case 0x95:
      case 0x97:
      case 0xa8:
      case 0xa9:
        goto switchD_0010c7b3_caseD_15;
      case 0xa0:
      case 0xa1:
        goto switchD_0010c7b3_caseD_20;
      case 0xa2:
        break;
      case 0xa5:
      case 0xa6:
      case 0xa7:
        goto switchD_0010c7b3_caseD_25;
      }
      goto switchD_0010c7f4_caseD_a2;
    }
    if (uVar17 < 0x80) {
switchD_0010c7b3_caseD_1:
      uVar18 = 1L << (bVar14 & 0x3f);
      bf->raresToFind = bf->raresToFind | uVar18;
    }
    else {
switchD_0010c7f4_caseD_a2:
      uVar18 = 1L << (bVar14 & 0x3f);
      bf->raresToFindM = bf->raresToFindM | uVar18;
      puVar13 = local_138;
    }
switchD_0010c7b3_caseD_2:
    *puVar13 = *puVar13 | uVar18;
LAB_0010ca14:
    uVar16 = uVar16 + 1;
  } while( true );
switchD_0010c7b3_caseD_10:
  uVar18 = 1L << (bVar14 & 0x3f);
  goto switchD_0010c7b3_caseD_2;
}

Assistant:

void setupBiomeFilter(
    BiomeFilter *bf,
    int mc, uint32_t flags,
    const int *required, int requiredLen,
    const int *excluded, int excludedLen,
    const int *matchany, int matchanyLen)
{
    int i, id;

    memset(bf, 0, sizeof(*bf));
    bf->flags = flags;

    // The matchany set is built from the intersection of each member,
    // individually treated as a required biome. The search can be aborted with
    // a positive result, as soon as any of those biomes is encountered.
    for (i = 0; i < matchanyLen; i++)
    {
        id = matchany[i];
        if (id < 128)
            bf->biomeToPick |= (1ULL << id);
        else
            bf->biomeToPickM |= (1ULL << (id-128));

        BiomeFilter ibf;
        setupBiomeFilter(&ibf, mc, 0, &id, 1, 0, 0, 0, 0);
        if (i == 0)
        {
            bf->tempsToFind  = ibf.tempsToFind;
            bf->otempToFind  = ibf.otempToFind;
            bf->majorToFind  = ibf.majorToFind;
            bf->edgesToFind  = ibf.edgesToFind;
            bf->raresToFind  = ibf.raresToFind;
            bf->raresToFindM = ibf.raresToFindM;
            bf->shoreToFind  = ibf.shoreToFind;
            bf->shoreToFindM = ibf.shoreToFindM;
            bf->riverToFind  = ibf.riverToFind;
            bf->riverToFindM = ibf.riverToFindM;
            bf->oceanToFind  = ibf.oceanToFind;
        }
        else
        {
            bf->tempsToFind  &= ibf.tempsToFind;
            bf->otempToFind  &= ibf.otempToFind;
            bf->majorToFind  &= ibf.majorToFind;
            bf->edgesToFind  &= ibf.edgesToFind;
            bf->raresToFind  &= ibf.raresToFind;
            bf->raresToFindM &= ibf.raresToFindM;
            bf->shoreToFind  &= ibf.shoreToFind;
            bf->shoreToFindM &= ibf.shoreToFindM;
            bf->riverToFind  &= ibf.riverToFind;
            bf->riverToFindM &= ibf.riverToFindM;
            bf->oceanToFind  &= ibf.oceanToFind;
        }
    }

    // The excluded set is built by checking which of the biomes from each
    // layer have the potential to yield something other than one of the
    // excluded biomes.
    for (i = 0; i < excludedLen; i++)
    {
        id = excluded[i];
        if (id & ~0xbf) // i.e. not in ranges [0,64),[128,192)
        {
            fprintf(stderr, "setupBiomeFilter: biomeID=%d not supported.\n", id);
            exit(-1);
        }
        if (id < 128)
            bf->biomeToExcl |= (1ULL << id);
        else
            bf->biomeToExclM |= (1ULL << (id-128));
    }
    if (excludedLen && mc >= MC_1_7)
    {   // TODO: this does not fully work yet...
        uint64_t b, m;
        int j;
        for (j = Oceanic; j <= Freezing+Special; j++)
        {
            b = m = 0;
            int temp = (j <= Freezing) ? j : ((j - Special) | 0xf00);
            genPotential(&b, &m, L_SPECIAL_1024, mc, flags, temp);
            if ((bf->biomeToExcl & b) || (bf->biomeToExclM & m))
                bf->tempsToExcl |= (1ULL << j);
        }
        for (j = 0; j < 256; j++)
        {
            if (!isOverworld(mc, j))
                continue;
            if (j < 128)
            {
                b = m = 0;
                genPotential(&b, &m, L_BIOME_256, mc, flags, j);
                if ((~bf->biomeToExcl & b) || (~bf->biomeToExclM & m))
                    bf->majorToExcl |= (1ULL << j);
            }
            b = m = 0;
            genPotential(&b, &m, L_BIOME_EDGE_64, mc, flags, j);
            if ((~bf->biomeToExcl & b) || (~bf->biomeToExclM & m))
            {
                if (j < 128)
                    bf->edgesToExcl |= (1ULL << j);
                else // bamboo_jungle are mapped onto & 0x3F
                    bf->edgesToExcl |= (1ULL << (j-128));
            }
            b = m = 0;
            genPotential(&b, &m, L_SUNFLOWER_64, mc, flags, j);
            if ((~bf->biomeToExcl & b) || (~bf->biomeToExclM & m))
            {
                if (j < 128)
                    bf->raresToExcl |= (1ULL << j);
                else
                    bf->raresToExclM |= (1ULL << (j-128));
            }
            b = m = 0;
            genPotential(&b, &m, L_SHORE_16, mc, flags, j);
            if ((~bf->biomeToExcl & b) || (~bf->biomeToExclM & m))
            {
                if (j < 128)
                    bf->shoreToExcl |= (1ULL << j);
                else
                    bf->shoreToExclM |= (1ULL << (j-128));
            }
            b = m = 0;
            genPotential(&b, &m, L_RIVER_MIX_4, mc, flags, j);
            if ((~bf->biomeToExcl & b) || (~bf->biomeToExclM & m))
            {
                if (j < 128)
                    bf->riverToExcl |= (1ULL << j);
                else
                    bf->riverToExclM |= (1ULL << (j-128));
            }
        }
    }

    // The required set is built from the biomes that should be present at each
    // of the layers. The search can be aborted with a negative result as soon
    // as a biome is missing at the corresponding layer.
    for (i = 0; i < requiredLen; i++)
    {
        id = required[i];
        if (id & ~0xbf) // i.e. not in ranges [0,64),[128,192)
        {
            fprintf(stderr, "setupBiomeFilter: biomeID=%d not supported.\n", id);
            exit(-1);
        }

        switch (id)
        {
        case mushroom_fields:
            // mushroom shores can generate with hills and at rivers
            bf->raresToFind |= (1ULL << mushroom_fields);
            // fall through
        case mushroom_field_shore:
            bf->tempsToFind |= (1ULL << Oceanic);
            bf->majorToFind |= (1ULL << mushroom_fields);
            bf->riverToFind |= (1ULL << id);
            break;

        case badlands_plateau:
        case wooded_badlands_plateau:
        case badlands:
        case eroded_badlands:
        case modified_badlands_plateau:
        case modified_wooded_badlands_plateau:
            bf->tempsToFind |= (1ULL << (Warm+Special));
            if (id == badlands_plateau || id == modified_badlands_plateau)
                bf->majorToFind |= (1ULL << badlands_plateau);
            if (id == wooded_badlands_plateau || id == modified_wooded_badlands_plateau)
                bf->majorToFind |= (1ULL << wooded_badlands_plateau);
            if (id < 128) {
                bf->raresToFind |= (1ULL << id);
                bf->riverToFind |= (1ULL << id);
            } else {
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            }
            break;

        case jungle:
        case jungle_edge:
        case jungle_hills:
        case modified_jungle:
        case modified_jungle_edge:
        case bamboo_jungle:
        case bamboo_jungle_hills:
            bf->tempsToFind |= (1ULL << (Lush+Special));
            bf->majorToFind |= (1ULL << jungle);
            if (id == bamboo_jungle || id == bamboo_jungle_hills) {
                // bamboo%64 are End biomes, so we can reuse the edgesToFind
                bf->edgesToFind |= (1ULL << (bamboo_jungle & 0x3f));
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            } else if (id == jungle_edge) {
                // un-modified jungle_edge can be created at shore layer
                bf->riverToFind |= (1ULL << jungle_edge);
            } else {
                if (id == modified_jungle_edge)
                    bf->edgesToFind |= (1ULL << jungle_edge);
                else
                    bf->edgesToFind |= (1ULL << jungle);
                if (id < 128) {
                    bf->raresToFind |= (1ULL << id);
                    bf->riverToFind |= (1ULL << id);
                } else {
                    bf->raresToFindM |= (1ULL << (id-128));
                    bf->riverToFindM |= (1ULL << (id-128));
                }
            }
            break;

        case giant_tree_taiga:
        case giant_tree_taiga_hills:
        case giant_spruce_taiga:
        case giant_spruce_taiga_hills:
            bf->tempsToFind |= (1ULL << (Cold+Special));
            bf->majorToFind |= (1ULL << giant_tree_taiga);
            bf->edgesToFind |= (1ULL << giant_tree_taiga);
            if (id < 128) {
                bf->raresToFind |= (1ULL << id);
                bf->riverToFind |= (1ULL << id);
            } else {
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            }
            break;

        case savanna:
        case savanna_plateau:
        case shattered_savanna:
        case shattered_savanna_plateau:
        case desert_hills:
        case desert_lakes:
            bf->tempsToFind |= (1ULL << Warm);
            if (id == desert_hills || id == desert_lakes) {
                bf->majorToFind |= (1ULL << desert);
                bf->edgesToFind |= (1ULL << desert);
            } else {
                bf->majorToFind |= (1ULL << savanna);
                bf->edgesToFind |= (1ULL << savanna);
            }
            if (id < 128) {
                bf->raresToFind |= (1ULL << id);
                bf->riverToFind |= (1ULL << id);
            } else {
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            }
            break;

        case dark_forest:
        case dark_forest_hills:
        case birch_forest:
        case birch_forest_hills:
        case tall_birch_forest:
        case tall_birch_hills:
        case swamp:
        case swamp_hills:
            bf->tempsToFind |= (1ULL << Lush);
            if (id == dark_forest || id == dark_forest_hills) {
                bf->majorToFind |= (1ULL << dark_forest);
                bf->edgesToFind |= (1ULL << dark_forest);
            }
            else if (id == birch_forest || id == birch_forest_hills ||
                     id == tall_birch_forest || id == tall_birch_hills) {
                bf->majorToFind |= (1ULL << birch_forest);
                bf->edgesToFind |= (1ULL << birch_forest);
            }
            else if (id == swamp || id == swamp_hills) {
                bf->majorToFind |= (1ULL << swamp);
                bf->edgesToFind |= (1ULL << swamp);
            }
            if (id < 128) {
                bf->raresToFind |= (1ULL << id);
                bf->riverToFind |= (1ULL << id);
            } else {
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            }
            break;

        case snowy_taiga:
        case snowy_taiga_hills:
        case snowy_taiga_mountains:
        case snowy_tundra:
        case snowy_mountains:
        case ice_spikes:
        case frozen_river:
            bf->tempsToFind |= (1ULL << Freezing);
            if (id == snowy_taiga || id == snowy_taiga_hills ||
                id == snowy_taiga_mountains)
                bf->edgesToFind |= (1ULL << snowy_taiga);
            else
                bf->edgesToFind |= (1ULL << snowy_tundra);
            if (id == frozen_river) {
                bf->raresToFind |= (1ULL << snowy_tundra);
                bf->riverToFind |= (1ULL << id);
            } else if (id < 128) {
                bf->raresToFind |= (1ULL << id);
                bf->riverToFind |= (1ULL << id);
            } else {
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            }
            break;

        case sunflower_plains:
            bf->raresToFindM |= (1ULL << (id-128));
            bf->riverToFindM |= (1ULL << (id-128));
            break;

        case snowy_beach:
            bf->tempsToFind |= (1ULL << Freezing);
            // fall through
        case beach:
        case stone_shore:
            bf->riverToFind |= (1ULL << id);
            break;

        case mountains:
            bf->majorToFind |= (1ULL << mountains);
            // fall through
        case wooded_mountains:
            bf->raresToFind |= (1ULL << id);
            bf->riverToFind |= (1ULL << id);
            break;
        case gravelly_mountains:
            bf->majorToFind |= (1ULL << mountains);
            // fall through
        case modified_gravelly_mountains:
            bf->raresToFindM |= (1ULL << (id-128));
            bf->riverToFindM |= (1ULL << (id-128));
            break;

        case taiga:
        case taiga_hills:
            bf->edgesToFind |= (1ULL << taiga);
            bf->raresToFind |= (1ULL << id);
            bf->riverToFind |= (1ULL << id);
            break;
        case taiga_mountains:
            bf->edgesToFind |= (1ULL << taiga);
            bf->raresToFindM |= (1ULL << (id-128));
            bf->riverToFindM |= (1ULL << (id-128));
            break;

        case plains:
        case forest:
        case wooded_hills:
            bf->raresToFind |= (1ULL << id);
            bf->riverToFind |= (1ULL << id);
            break;
        case flower_forest:
            bf->raresToFindM |= (1ULL << (id-128));
            bf->riverToFindM |= (1ULL << (id-128));
            break;

        case desert: // can generate at shore layer
            bf->riverToFind |= (1ULL << id);
            break;

        default:
            if (isOceanic(id)) {
                bf->tempsToFind |= (1ULL << Oceanic);
                bf->oceanToFind |= (1ULL << id);
                if (isShallowOcean(id)) {
                    if (id != lukewarm_ocean && id != cold_ocean)
                        bf->otempToFind |= (1ULL << id);
                } else {
                    if (id == deep_warm_ocean)
                        bf->otempToFind |= (1ULL << warm_ocean);
                    else if (id == deep_ocean)
                        bf->otempToFind |= (1ULL << ocean);
                    else if (id == deep_frozen_ocean)
                        bf->otempToFind |= (1ULL << frozen_ocean);
                    if (!(flags & FORCE_OCEAN_VARIANTS)) {
                        bf->raresToFind |= (1ULL << deep_ocean);
                        bf->riverToFind |= (1ULL << deep_ocean);
                    }
                }
            } else {
                if (id < 64)
                    bf->riverToFind |= (1ULL << id);
                else
                    bf->riverToFindM |= (1ULL << (id-128));
            }
            break;
        }
    }

    bf->biomeToFind = bf->riverToFind;
    bf->biomeToFind &= ~((1ULL << ocean) | (1ULL << deep_ocean));
    bf->biomeToFind |= bf->oceanToFind;
    bf->biomeToFindM = bf->riverToFindM;

    bf->shoreToFind = bf->riverToFind;
    bf->shoreToFind &= ~((1ULL << river) | (1ULL << frozen_river));
    bf->shoreToFindM = bf->riverToFindM;

    bf->specialCnt = 0;
    bf->specialCnt += !!(bf->tempsToFind & (1ULL << (Warm+Special)));
    bf->specialCnt += !!(bf->tempsToFind & (1ULL << (Lush+Special)));
    bf->specialCnt += !!(bf->tempsToFind & (1ULL << (Cold+Special)));
}